

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O2

void __thiscall cppcms::impl::tcp_cache::rise(tcp_cache *this,string *trigger)

{
  string data;
  string sStack_68;
  tcp_operation_header local_48;
  
  local_48.operations.data.timeout = 0;
  local_48.operations._16_8_ = 0;
  local_48.filler[0] = 0;
  local_48.filler[1] = 0;
  local_48.operations.fetch.current_gen = 0;
  local_48.opcode = 1;
  local_48.size = (uint32_t)trigger->_M_string_length;
  std::__cxx11::string::string((string *)&sStack_68,(string *)trigger);
  local_48.operations.out_stats.keys = (int)trigger->_M_string_length;
  tcp_connector::broadcast(&this->super_tcp_connector,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  return;
}

Assistant:

void tcp_cache::rise(std::string const &trigger)
{
	tcp_operation_header h=tcp_operation_header();
	h.opcode=opcodes::rise;
	h.size=trigger.size();
	std::string data=trigger;
	h.operations.rise.trigger_len=trigger.size();
	broadcast(h,data);
}